

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

int ncnn_option_get_use_vulkan_compute(ncnn_option_t opt)

{
  ncnn_option_t opt_local;
  
  return 0;
}

Assistant:

int ncnn_option_get_use_vulkan_compute(const ncnn_option_t opt)
{
#if NCNN_VULKAN
    return ((const Option*)opt)->use_vulkan_compute;
#else
    (void)opt;
    return 0;
#endif
}